

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O3

void send_cgreen_message(int messaging,int result)

{
  CgreenMessageQueue *pCVar1;
  long *buf;
  
  buf = (long *)calloc(1,0x10);
  pCVar1 = queues;
  if (buf != (long *)0x0) {
    *buf = (long)queues[messaging].tag;
    *(int *)(buf + 1) = result;
    cgreen_pipe_write(pCVar1[messaging].writepipe,buf,0x10);
    sched_yield();
    free(buf);
    return;
  }
  return;
}

Assistant:

void send_cgreen_message(int messaging, int result) {
    CgreenMessage *message;
    
    message = (CgreenMessage *) malloc(sizeof(CgreenMessage));
    if (message == NULL) {
      return;
    }
    memset(message, 0, sizeof(*message));
    message->type = queues[messaging].tag;
    message->result = result;
    cgreen_pipe_write(queues[messaging].writepipe, message, sizeof(CgreenMessage));
    // give the parent a chance to read so that failures are more likely to be output
    // before the child crashes
    sched_yield();

    free(message);
}